

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O1

int gcm_mask(mbedtls_gcm_context *ctx,uchar *ectr,size_t offset,size_t use_len,uchar *input,
            uchar *output)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t olen;
  size_t local_38;
  
  local_38 = 0;
  iVar1 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,ectr,&local_38);
  if (iVar1 == 0) {
    if (ctx->mode == '\0') {
      if (use_len < 8) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        do {
          *(ulong *)(ctx->buf + uVar3 + offset + 0x178 + -0x178) =
               *(ulong *)(ctx->buf + uVar3 + offset + 0x178 + -0x178) ^ *(ulong *)(input + uVar3);
          uVar2 = uVar3 + 8;
          uVar4 = uVar3 + 0x10;
          uVar3 = uVar2;
        } while (uVar4 <= use_len);
      }
      if (uVar2 < use_len) {
        do {
          ctx->buf[uVar2 + offset + 0x178 + -0x178] =
               ctx->buf[uVar2 + offset + 0x178 + -0x178] ^ input[uVar2];
          uVar2 = uVar2 + 1;
        } while (use_len != uVar2);
      }
    }
    if (use_len < 8) {
      uVar2 = 0;
    }
    else {
      uVar3 = 0;
      do {
        *(ulong *)(output + uVar3) = *(ulong *)(input + uVar3) ^ *(ulong *)(ectr + uVar3 + offset);
        uVar2 = uVar3 + 8;
        uVar4 = uVar3 + 0x10;
        uVar3 = uVar2;
      } while (uVar4 <= use_len);
    }
    if (uVar2 < use_len) {
      do {
        output[uVar2] = input[uVar2] ^ ectr[uVar2 + offset];
        uVar2 = uVar2 + 1;
      } while (use_len != uVar2);
    }
    iVar1 = 0;
    if (ctx->mode == '\x01') {
      if (use_len < 8) {
        uVar2 = 0;
      }
      else {
        uVar3 = 0;
        do {
          *(ulong *)(ctx->buf + uVar3 + offset + 0x178 + -0x178) =
               *(ulong *)(ctx->buf + uVar3 + offset + 0x178 + -0x178) ^ *(ulong *)(output + uVar3);
          uVar2 = uVar3 + 8;
          uVar4 = uVar3 + 0x10;
          uVar3 = uVar2;
        } while (uVar4 <= use_len);
      }
      iVar1 = 0;
      if (uVar2 < use_len) {
        do {
          ctx->buf[uVar2 + offset + 0x178 + -0x178] =
               ctx->buf[uVar2 + offset + 0x178 + -0x178] ^ output[uVar2];
          uVar2 = uVar2 + 1;
          iVar1 = 0;
        } while (use_len != uVar2);
      }
    }
  }
  else {
    mbedtls_platform_zeroize(ectr,0x10);
  }
  return iVar1;
}

Assistant:

static int gcm_mask(mbedtls_gcm_context *ctx,
                    unsigned char ectr[16],
                    size_t offset, size_t use_len,
                    const unsigned char *input,
                    unsigned char *output)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    ret = mbedtls_block_cipher_encrypt(&ctx->block_cipher_ctx, ctx->y, ectr);
#else
    size_t olen = 0;
    ret = mbedtls_cipher_update(&ctx->cipher_ctx, ctx->y, 16, ectr, &olen);
#endif
    if (ret != 0) {
        mbedtls_platform_zeroize(ectr, 16);
        return ret;
    }

    if (ctx->mode == MBEDTLS_GCM_DECRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, input, use_len);
    }
    mbedtls_xor(output, ectr + offset, input, use_len);
    if (ctx->mode == MBEDTLS_GCM_ENCRYPT) {
        mbedtls_xor(ctx->buf + offset, ctx->buf + offset, output, use_len);
    }

    return 0;
}